

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_constants.cpp
# Opt level: O0

void __thiscall
twitter::zipkin::thrift::zipkincoreConstants::zipkincoreConstants(zipkincoreConstants *this)

{
  zipkincoreConstants *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->CLIENT_RECV);
  std::__cxx11::string::string((string *)&this->SERVER_SEND);
  std::__cxx11::string::string((string *)&this->SERVER_RECV);
  std::__cxx11::string::string((string *)&this->MESSAGE_SEND);
  std::__cxx11::string::string((string *)&this->MESSAGE_RECV);
  std::__cxx11::string::string((string *)&this->WIRE_SEND);
  std::__cxx11::string::string((string *)&this->WIRE_RECV);
  std::__cxx11::string::string((string *)&this->CLIENT_SEND_FRAGMENT);
  std::__cxx11::string::string((string *)&this->CLIENT_RECV_FRAGMENT);
  std::__cxx11::string::string((string *)&this->SERVER_SEND_FRAGMENT);
  std::__cxx11::string::string((string *)&this->SERVER_RECV_FRAGMENT);
  std::__cxx11::string::string((string *)&this->LOCAL_COMPONENT);
  std::__cxx11::string::string((string *)&this->CLIENT_ADDR);
  std::__cxx11::string::string((string *)&this->SERVER_ADDR);
  std::__cxx11::string::string((string *)&this->MESSAGE_ADDR);
  std::__cxx11::string::operator=((string *)this,"cs");
  std::__cxx11::string::operator=((string *)&this->CLIENT_RECV,"cr");
  std::__cxx11::string::operator=((string *)&this->SERVER_SEND,"ss");
  std::__cxx11::string::operator=((string *)&this->SERVER_RECV,"sr");
  std::__cxx11::string::operator=((string *)&this->MESSAGE_SEND,"ms");
  std::__cxx11::string::operator=((string *)&this->MESSAGE_RECV,"mr");
  std::__cxx11::string::operator=((string *)&this->WIRE_SEND,"ws");
  std::__cxx11::string::operator=((string *)&this->WIRE_RECV,"wr");
  std::__cxx11::string::operator=((string *)&this->CLIENT_SEND_FRAGMENT,"csf");
  std::__cxx11::string::operator=((string *)&this->CLIENT_RECV_FRAGMENT,"crf");
  std::__cxx11::string::operator=((string *)&this->SERVER_SEND_FRAGMENT,"ssf");
  std::__cxx11::string::operator=((string *)&this->SERVER_RECV_FRAGMENT,"srf");
  std::__cxx11::string::operator=((string *)&this->LOCAL_COMPONENT,"lc");
  std::__cxx11::string::operator=((string *)&this->CLIENT_ADDR,"ca");
  std::__cxx11::string::operator=((string *)&this->SERVER_ADDR,"sa");
  std::__cxx11::string::operator=((string *)&this->MESSAGE_ADDR,"ma");
  return;
}

Assistant:

zipkincoreConstants::zipkincoreConstants() {
  CLIENT_SEND = "cs";

  CLIENT_RECV = "cr";

  SERVER_SEND = "ss";

  SERVER_RECV = "sr";

  MESSAGE_SEND = "ms";

  MESSAGE_RECV = "mr";

  WIRE_SEND = "ws";

  WIRE_RECV = "wr";

  CLIENT_SEND_FRAGMENT = "csf";

  CLIENT_RECV_FRAGMENT = "crf";

  SERVER_SEND_FRAGMENT = "ssf";

  SERVER_RECV_FRAGMENT = "srf";

  LOCAL_COMPONENT = "lc";

  CLIENT_ADDR = "ca";

  SERVER_ADDR = "sa";

  MESSAGE_ADDR = "ma";

}